

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::GELU_x86_avx::forward_inplace(GELU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  long *in_RSI;
  long in_RDI;
  float fVar10;
  float fVar12;
  float fVar13;
  float fVar15;
  float fVar16;
  undefined8 uVar14;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar11 [32];
  v4sf afVar20;
  __m128 _blob_1;
  __m128 _cube_1;
  __m128 _pLoad_1;
  __m128 _fast2c128;
  __m128 _fast1c128;
  __m128 _one128;
  __m128 _half128;
  __m256 _blob;
  __m256 _cube;
  __m256 _pLoad;
  __m256 _fast2c256;
  __m256 _fast1c256;
  __m256 _one256;
  __m256 _half256;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int elempack;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 dst;
  __m256 q_1;
  __m256 p;
  __m256 value_squared;
  __m256 value;
  undefined8 local_f90;
  undefined8 uStackY_f88;
  undefined8 local_f20;
  undefined8 uStackY_f18;
  undefined8 uStackY_f10;
  undefined8 uStackY_f08;
  Option *in_stack_fffffffffffff158;
  Mat *in_stack_fffffffffffff160;
  GELU *in_stack_fffffffffffff168;
  int local_e30;
  undefined8 local_e20;
  undefined8 local_e18;
  undefined8 local_e10;
  undefined4 local_e08;
  long local_e00;
  undefined4 local_df8;
  undefined4 local_df4;
  undefined4 local_df0;
  undefined4 local_dec;
  undefined4 local_de8;
  undefined8 local_de0;
  float *local_dd8;
  int local_dcc;
  int local_dc8;
  int local_dc4;
  int local_dc0;
  int local_dbc;
  int local_db8;
  int local_db4;
  long *local_da8;
  int local_d94;
  undefined1 local_d8d;
  int local_d8c;
  undefined8 *local_d80;
  undefined8 *local_d78;
  undefined8 *local_d68;
  undefined4 local_d58;
  undefined4 local_d54;
  undefined4 local_d50;
  undefined4 local_d4c;
  float *local_d48;
  float local_d40;
  float fStack_d3c;
  float fStack_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float fStack_d28;
  float fStack_d24;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined1 local_b40 [32];
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  float local_b00;
  float fStack_afc;
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [32];
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  float *local_9d8;
  undefined4 local_9d0;
  undefined4 uStack_9cc;
  undefined4 uStack_9c8;
  undefined4 uStack_9c4;
  undefined4 local_9b4;
  undefined4 local_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined4 local_994;
  undefined4 local_990;
  undefined4 uStack_98c;
  undefined4 uStack_988;
  undefined4 uStack_984;
  undefined4 local_974;
  undefined4 local_970;
  undefined4 uStack_96c;
  undefined4 uStack_968;
  undefined4 uStack_964;
  undefined4 local_95c;
  float *local_958;
  float local_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  float *local_838;
  long local_830;
  undefined4 local_824;
  long local_820;
  float *local_818;
  undefined4 local_80c;
  int local_808;
  int local_804;
  undefined8 *local_800;
  undefined4 local_7f4;
  long local_7f0;
  undefined8 *local_7d0;
  undefined1 local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined4 local_780;
  undefined4 local_77c;
  undefined4 local_778;
  undefined4 local_774;
  undefined4 local_770;
  undefined4 local_76c;
  undefined4 local_768;
  undefined4 local_764;
  undefined1 local_760 [16];
  undefined1 auStack_750 [16];
  undefined4 local_740;
  undefined4 local_73c;
  undefined4 local_738;
  undefined4 local_734;
  undefined4 local_730;
  undefined4 local_72c;
  undefined4 local_728;
  undefined4 local_724;
  undefined1 local_720 [16];
  undefined1 auStack_710 [16];
  undefined4 local_700;
  undefined4 local_6fc;
  undefined4 local_6f8;
  undefined4 local_6f4;
  undefined4 local_6f0;
  undefined4 local_6ec;
  undefined4 local_6e8;
  undefined4 local_6e4;
  undefined1 local_6e0 [32];
  undefined4 local_6c0;
  undefined4 local_6bc;
  undefined4 local_6b8;
  undefined4 local_6b4;
  undefined4 local_6b0;
  undefined4 local_6ac;
  undefined4 local_6a8;
  undefined4 local_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  float *local_618;
  float *local_610;
  float *local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0 [2];
  float afStack_5b8 [2];
  float afStack_5b0 [2];
  float afStack_5a8 [2];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float *local_578;
  float *local_570;
  float *local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520 [2];
  float afStack_518 [2];
  float afStack_510 [2];
  float afStack_508 [2];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float *local_4d8;
  float *local_4d0;
  float *local_4c8;
  float local_4c0 [2];
  float afStack_4b8 [2];
  float afStack_4b0 [2];
  float afStack_4a8 [2];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  float local_480 [2];
  float afStack_478 [2];
  float afStack_470 [2];
  float afStack_468 [2];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float *local_438;
  float *local_430;
  float *local_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3e0 [2];
  float afStack_3d8 [2];
  float afStack_3d0 [2];
  float afStack_3c8 [2];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float *local_398;
  float *local_390;
  float *local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340 [2];
  float afStack_338 [2];
  float afStack_330 [2];
  float afStack_328 [2];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float *local_2f8;
  float *local_2f0;
  float *local_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0 [2];
  float afStack_298 [2];
  float afStack_290 [2];
  float afStack_288 [2];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float *local_258;
  float *local_250;
  float *local_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float local_200 [2];
  float afStack_1f8 [2];
  float afStack_1f0 [2];
  float afStack_1e8 [2];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float *local_1b8;
  float *local_1b0;
  float *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float local_160 [2];
  float afStack_158 [2];
  float afStack_150 [2];
  float afStack_148 [2];
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float *local_118;
  float *local_110;
  float *local_108;
  float local_100 [2];
  float afStack_f8 [2];
  float afStack_f0 [2];
  float afStack_e8 [2];
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0 [2];
  float afStack_b8 [2];
  float afStack_b0 [2];
  float afStack_a8 [2];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  if (*(int *)(in_RDI + 0xd0) == 0) {
    local_d94 = GELU::forward_inplace
                          (in_stack_fffffffffffff168,in_stack_fffffffffffff160,
                           in_stack_fffffffffffff158);
  }
  else {
    local_db4 = *(int *)((long)in_RSI + 0x2c);
    local_db8 = (int)in_RSI[6];
    local_dbc = *(int *)((long)in_RSI + 0x34);
    local_dc0 = (int)in_RSI[3];
    local_dc4 = (int)in_RSI[7];
    local_dc8 = local_db4 * local_db8 * local_dbc * local_dc0;
    local_da8 = in_RSI;
    for (local_dcc = 0; local_dcc < local_dc4; local_dcc = local_dcc + 1) {
      local_d80 = &local_e20;
      local_804 = *(int *)((long)local_da8 + 0x2c);
      local_808 = (int)local_da8[6];
      local_80c = *(undefined4 *)((long)local_da8 + 0x34);
      local_818 = (float *)(*local_da8 + local_da8[8] * (long)local_dcc * local_da8[2]);
      local_820 = local_da8[2];
      local_824 = (undefined4)local_da8[3];
      local_830 = local_da8[4];
      local_800 = &local_e20;
      local_7f0 = (long)local_804 * (long)local_808 * local_820;
      local_d78 = &local_e20;
      local_d68 = &local_e20;
      local_7f4 = 0x10;
      local_d8c = local_dcc;
      local_d8d = 1;
      local_e20 = 0;
      local_e10 = 0;
      local_e08 = 0;
      local_df8 = 0;
      local_df4 = 0;
      local_df0 = 0;
      local_dec = 0;
      local_de8 = 0;
      local_de0 = 0;
      local_e18 = 0;
      local_e30 = 0;
      local_d4c = 0x3f000000;
      local_764 = 0x3f000000;
      local_768 = 0x3f000000;
      local_76c = 0x3f000000;
      local_770 = 0x3f000000;
      local_774 = 0x3f000000;
      local_778 = 0x3f000000;
      local_77c = 0x3f000000;
      local_780 = 0x3f000000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x20);
      local_7a0 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x20);
      auStack_790 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x30);
      local_d50 = 0x3f800000;
      local_724 = 0x3f800000;
      local_728 = 0x3f800000;
      local_72c = 0x3f800000;
      local_730 = 0x3f800000;
      local_734 = 0x3f800000;
      local_738 = 0x3f800000;
      local_73c = 0x3f800000;
      local_740 = 0x3f800000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      local_760 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      auStack_750 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      local_d54 = 0x3f4c4229;
      local_6e4 = 0x3f4c4229;
      local_6e8 = 0x3f4c4229;
      local_6ec = 0x3f4c4229;
      local_6f0 = 0x3f4c4229;
      local_6f4 = 0x3f4c4229;
      local_6f8 = 0x3f4c4229;
      local_6fc = 0x3f4c4229;
      local_700 = 0x3f4c4229;
      auVar1 = vinsertps_avx(ZEXT416(0x3f4c4229),ZEXT416(0x3f4c4229),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f4c4229),0x20);
      local_720 = vinsertps_avx(auVar1,ZEXT416(0x3f4c4229),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3f4c4229),ZEXT416(0x3f4c4229),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f4c4229),0x20);
      auStack_710 = vinsertps_avx(auVar1,ZEXT416(0x3f4c4229),0x30);
      local_d58 = 0x3d372713;
      local_6a4 = 0x3d372713;
      local_6a8 = 0x3d372713;
      local_6ac = 0x3d372713;
      local_6b0 = 0x3d372713;
      local_6b4 = 0x3d372713;
      local_6b8 = 0x3d372713;
      local_6bc = 0x3d372713;
      local_6c0 = 0x3d372713;
      auVar1 = vinsertps_avx(ZEXT416(0x3d372713),ZEXT416(0x3d372713),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3d372713),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3d372713),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3d372713),ZEXT416(0x3d372713),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d372713),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d372713),0x30);
      auVar11._16_16_ = auVar1;
      auVar11._0_16_ = auVar2;
      local_6e0._0_8_ = auVar2._0_8_;
      local_6e0._8_8_ = auVar2._8_8_;
      local_6e0._16_8_ = auVar1._0_8_;
      local_6e0._24_8_ = auVar1._8_8_;
      local_dd8 = local_818;
      for (; local_e30 + 7 < local_dc8; local_e30 = local_e30 + 8) {
        local_d48 = local_dd8;
        local_d00 = *(undefined8 *)local_dd8;
        uStack_cf8 = *(undefined8 *)(local_dd8 + 2);
        uStack_cf0 = *(undefined8 *)(local_dd8 + 4);
        uStack_ce8 = *(undefined8 *)(local_dd8 + 6);
        local_be0._0_4_ = (float)local_d00;
        local_be0._4_4_ = (float)((ulong)local_d00 >> 0x20);
        uStack_bd8._0_4_ = (float)uStack_cf8;
        uStack_bd8._4_4_ = (float)((ulong)uStack_cf8 >> 0x20);
        uStack_bd0._0_4_ = (float)uStack_cf0;
        uStack_bd0._4_4_ = (float)((ulong)uStack_cf0 >> 0x20);
        uStack_bc8._0_4_ = (float)uStack_ce8;
        uStack_bc8._4_4_ = (float)((ulong)uStack_ce8 >> 0x20);
        local_c40 = CONCAT44(local_be0._4_4_ * local_be0._4_4_,(float)local_be0 * (float)local_be0);
        uStack_c38 = CONCAT44(uStack_bd8._4_4_ * uStack_bd8._4_4_,
                              (float)uStack_bd8 * (float)uStack_bd8);
        uStack_c30 = CONCAT44(uStack_bd0._4_4_ * uStack_bd0._4_4_,
                              (float)uStack_bd0 * (float)uStack_bd0);
        uStack_c28 = CONCAT44(uStack_bc8._4_4_,(float)uStack_bc8 * (float)uStack_bc8);
        fVar10 = (float)local_be0 * (float)local_be0 * (float)local_be0;
        fVar12 = local_be0._4_4_ * local_be0._4_4_ * local_be0._4_4_;
        fVar13 = (float)uStack_bd8 * (float)uStack_bd8 * (float)uStack_bd8;
        fVar15 = uStack_bd8._4_4_ * uStack_bd8._4_4_ * uStack_bd8._4_4_;
        fVar17 = (float)uStack_bd0 * (float)uStack_bd0 * (float)uStack_bd0;
        fVar18 = uStack_bd0._4_4_ * uStack_bd0._4_4_ * uStack_bd0._4_4_;
        fVar19 = (float)uStack_bc8 * (float)uStack_bc8 * (float)uStack_bc8;
        local_c80 = CONCAT44(fVar12,fVar10);
        uStack_c78 = CONCAT44(fVar15,fVar13);
        uStack_c70 = CONCAT44(fVar18,fVar17);
        uStack_c68 = CONCAT44(uStack_bc8._4_4_,fVar19);
        local_c60._0_4_ = auVar2._0_4_;
        local_c60._4_4_ = auVar2._4_4_;
        uStack_c58._0_4_ = auVar2._8_4_;
        uStack_c58._4_4_ = auVar2._12_4_;
        uStack_c50._0_4_ = auVar1._0_4_;
        uStack_c50._4_4_ = auVar1._4_4_;
        uStack_c48._0_4_ = auVar1._8_4_;
        uStack_c48._4_4_ = auVar1._12_4_;
        local_c60._0_4_ = (float)local_c60 * fVar10;
        local_c60._4_4_ = local_c60._4_4_ * fVar12;
        uStack_c58._0_4_ = (float)uStack_c58 * fVar13;
        uStack_c58._4_4_ = uStack_c58._4_4_ * fVar15;
        uStack_c50._0_4_ = (float)uStack_c50 * fVar17;
        uStack_c50._4_4_ = uStack_c50._4_4_ * fVar18;
        uStack_c48._0_4_ = (float)uStack_c48 * fVar19;
        local_f20 = CONCAT44(local_c60._4_4_,(float)local_c60);
        uStackY_f18 = CONCAT44(uStack_c58._4_4_,(float)uStack_c58);
        uStackY_f10 = CONCAT44(uStack_c50._4_4_,(float)uStack_c50);
        uStackY_f08 = CONCAT44(uStack_c48._4_4_,(float)uStack_c48);
        local_b80 = local_f20;
        uStack_b78 = uStackY_f18;
        uStack_b70 = uStackY_f10;
        uStack_b68 = uStackY_f08;
        local_c60._0_4_ = (float)local_be0 + (float)local_c60;
        local_c60._4_4_ = local_be0._4_4_ + local_c60._4_4_;
        uStack_c58._0_4_ = (float)uStack_bd8 + (float)uStack_c58;
        uStack_c58._4_4_ = uStack_bd8._4_4_ + uStack_c58._4_4_;
        uStack_c50._0_4_ = (float)uStack_bd0 + (float)uStack_c50;
        uStack_c50._4_4_ = uStack_bd0._4_4_ + uStack_c50._4_4_;
        uStack_c48._0_4_ = (float)uStack_bc8 + (float)uStack_c48;
        local_f20 = CONCAT44(local_c60._4_4_,(float)local_c60);
        uStackY_f18 = CONCAT44(uStack_c58._4_4_,(float)uStack_c58);
        uStackY_f10 = CONCAT44(uStack_c50._4_4_,(float)uStack_c50);
        uStackY_f08 = CONCAT44(uStack_bc8._4_4_ + uStack_c48._4_4_,(float)uStack_c48);
        local_cc0 = local_f20;
        uStack_cb8 = uStackY_f18;
        uStack_cb0 = uStackY_f10;
        uStack_ca8 = uStackY_f08;
        local_ca0._0_4_ = local_720._0_4_;
        local_ca0._4_4_ = local_720._4_4_;
        uStack_c98._0_4_ = local_720._8_4_;
        uStack_c98._4_4_ = local_720._12_4_;
        uStack_c90._0_4_ = auStack_710._0_4_;
        uStack_c90._4_4_ = auStack_710._4_4_;
        uStack_c88._0_4_ = auStack_710._8_4_;
        uStack_c88._4_4_ = auStack_710._12_4_;
        local_f20 = CONCAT44(local_ca0._4_4_ * local_c60._4_4_,(float)local_ca0 * (float)local_c60);
        uStackY_f18 = CONCAT44(uStack_c98._4_4_ * uStack_c58._4_4_,
                               (float)uStack_c98 * (float)uStack_c58);
        uStackY_f10 = CONCAT44(uStack_c90._4_4_ * uStack_c50._4_4_,
                               (float)uStack_c90 * (float)uStack_c50);
        uStackY_f08 = CONCAT44(uStack_c88._4_4_,(float)uStack_c88 * (float)uStack_c48);
        local_aa0 = local_f20;
        uStack_a98 = uStackY_f18;
        uStack_a90 = uStackY_f10;
        uStack_a88 = uStackY_f08;
        local_ac0._8_8_ = uStackY_f18;
        local_ac0._0_8_ = local_f20;
        local_6a0 = local_f20;
        uStack_698 = uStackY_f18;
        uStack_690 = uStackY_f10;
        uStack_688 = uStackY_f08;
        local_680 = 0xc1100000c1100000;
        uStack_678 = 0xc1100000c1100000;
        uStack_670 = 0xc1100000c1100000;
        uStack_668 = 0xc1100000c1100000;
        auVar6._8_8_ = 0xc1100000c1100000;
        auVar6._0_8_ = 0xc1100000c1100000;
        auVar6._16_8_ = 0xc1100000c1100000;
        auVar6._24_8_ = 0xc1100000c1100000;
        auVar3._16_8_ = uStackY_f10;
        auVar3._0_16_ = local_ac0._0_16_;
        auVar3._24_8_ = uStackY_f08;
        auVar3 = vmaxps_avx(auVar6,auVar3);
        local_ac0._0_8_ = auVar3._0_8_;
        local_660 = local_ac0._0_8_;
        local_ac0._8_8_ = auVar3._8_8_;
        uStack_658 = local_ac0._8_8_;
        local_ac0._16_8_ = auVar3._16_8_;
        uStack_650 = local_ac0._16_8_;
        local_ac0._24_8_ = auVar3._24_8_;
        uStack_648 = local_ac0._24_8_;
        local_640 = 0x4110000041100000;
        uStack_638 = 0x4110000041100000;
        uStack_630 = 0x4110000041100000;
        uStack_628 = 0x4110000041100000;
        auVar7._8_8_ = 0x4110000041100000;
        auVar7._0_8_ = 0x4110000041100000;
        auVar7._16_8_ = 0x4110000041100000;
        auVar7._24_8_ = 0x4110000041100000;
        local_ac0 = vminps_avx(auVar7,auVar3);
        local_a40 = local_ac0._0_8_;
        uStack_a38 = local_ac0._8_8_;
        uStack_a30 = local_ac0._16_8_;
        uStack_a28 = local_ac0._24_8_;
        local_a20._0_4_ = local_ac0._0_4_;
        local_a20._4_4_ = local_ac0._4_4_;
        uStack_a18._0_4_ = local_ac0._8_4_;
        uStack_a18._4_4_ = local_ac0._12_4_;
        uStack_a10._0_4_ = local_ac0._16_4_;
        uStack_a10._4_4_ = local_ac0._20_4_;
        uStack_a08._0_4_ = local_ac0._24_4_;
        uStack_a08._4_4_ = local_ac0._28_4_;
        fStack_ac4 = uStack_a08._4_4_;
        local_ae0 = (float)local_a20 * (float)local_a20;
        fStack_adc = local_a20._4_4_ * local_a20._4_4_;
        fStack_ad8 = (float)uStack_a18 * (float)uStack_a18;
        fStack_ad4 = uStack_a18._4_4_ * uStack_a18._4_4_;
        fStack_ad0 = (float)uStack_a10 * (float)uStack_a10;
        fStack_acc = uStack_a10._4_4_ * uStack_a10._4_4_;
        fStack_ac8 = (float)uStack_a08 * (float)uStack_a08;
        local_108 = &local_ae0;
        local_110 = _ps256_cephes_tanh_p0;
        local_118 = _ps256_cephes_tanh_p1;
        fStack_c4 = uStack_a08._4_4_;
        local_100[0] = -2.7607684e-16;
        local_100[1] = -2.7607684e-16;
        afStack_f8[0] = -2.7607684e-16;
        afStack_f8[1] = -2.7607684e-16;
        afStack_f0[0] = -2.7607684e-16;
        afStack_f0[1] = -2.7607684e-16;
        afStack_e8[0] = -2.7607684e-16;
        afStack_e8[1] = -2.7607684e-16;
        local_a0 = local_ae0 * -2.7607684e-16;
        fStack_9c = fStack_adc * -2.7607684e-16;
        fStack_98 = fStack_ad8 * -2.7607684e-16;
        fStack_94 = fStack_ad4 * -2.7607684e-16;
        fStack_90 = fStack_ad0 * -2.7607684e-16;
        fStack_8c = fStack_acc * -2.7607684e-16;
        fStack_88 = fStack_ac8 * -2.7607684e-16;
        local_c0[0] = 2.000188e-13;
        local_c0[1] = 2.000188e-13;
        afStack_b8[0] = 2.000188e-13;
        afStack_b8[1] = 2.000188e-13;
        afStack_b0[0] = 2.000188e-13;
        afStack_b0[1] = 2.000188e-13;
        afStack_a8[0] = 2.000188e-13;
        afStack_a8[1] = 2.000188e-13;
        local_180 = local_a0 + 2.000188e-13;
        fStack_17c = fStack_9c + 2.000188e-13;
        fStack_178 = fStack_98 + 2.000188e-13;
        fStack_174 = fStack_94 + 2.000188e-13;
        fStack_170 = fStack_90 + 2.000188e-13;
        fStack_16c = fStack_8c + 2.000188e-13;
        fStack_168 = fStack_88 + 2.000188e-13;
        fStack_164 = uStack_a08._4_4_ + 2.000188e-13;
        local_1a8 = &local_b00;
        local_1b0 = &local_ae0;
        local_1b8 = _ps256_cephes_tanh_p2;
        local_1a0 = CONCAT44(fStack_adc,local_ae0);
        uStack_198 = CONCAT44(fStack_ad4,fStack_ad8);
        uStack_190 = CONCAT44(fStack_acc,fStack_ad0);
        uStack_188 = CONCAT44(uStack_a08._4_4_,fStack_ac8);
        local_140 = local_180 * local_ae0;
        fStack_13c = fStack_17c * fStack_adc;
        fStack_138 = fStack_178 * fStack_ad8;
        fStack_134 = fStack_174 * fStack_ad4;
        fStack_130 = fStack_170 * fStack_ad0;
        fStack_12c = fStack_16c * fStack_acc;
        fStack_128 = fStack_168 * fStack_ac8;
        local_160[0] = -8.604672e-11;
        local_160[1] = -8.604672e-11;
        afStack_158[0] = -8.604672e-11;
        afStack_158[1] = -8.604672e-11;
        afStack_150[0] = -8.604672e-11;
        afStack_150[1] = -8.604672e-11;
        afStack_148[0] = -8.604672e-11;
        afStack_148[1] = -8.604672e-11;
        local_220 = local_140 + -8.604672e-11;
        fStack_21c = fStack_13c + -8.604672e-11;
        fStack_218 = fStack_138 + -8.604672e-11;
        fStack_214 = fStack_134 + -8.604672e-11;
        fStack_210 = fStack_130 + -8.604672e-11;
        fStack_20c = fStack_12c + -8.604672e-11;
        fStack_208 = fStack_128 + -8.604672e-11;
        fStack_204 = fStack_164 + -8.604672e-11;
        local_248 = &local_b00;
        local_250 = &local_ae0;
        local_258 = _ps256_cephes_tanh_p3;
        local_240 = CONCAT44(fStack_adc,local_ae0);
        uStack_238 = CONCAT44(fStack_ad4,fStack_ad8);
        uStack_230 = CONCAT44(fStack_acc,fStack_ad0);
        uStack_228 = CONCAT44(uStack_a08._4_4_,fStack_ac8);
        local_1e0 = local_220 * local_ae0;
        fStack_1dc = fStack_21c * fStack_adc;
        fStack_1d8 = fStack_218 * fStack_ad8;
        fStack_1d4 = fStack_214 * fStack_ad4;
        fStack_1d0 = fStack_210 * fStack_ad0;
        fStack_1cc = fStack_20c * fStack_acc;
        fStack_1c8 = fStack_208 * fStack_ac8;
        local_200[0] = 5.1222973e-08;
        local_200[1] = 5.1222973e-08;
        afStack_1f8[0] = 5.1222973e-08;
        afStack_1f8[1] = 5.1222973e-08;
        afStack_1f0[0] = 5.1222973e-08;
        afStack_1f0[1] = 5.1222973e-08;
        afStack_1e8[0] = 5.1222973e-08;
        afStack_1e8[1] = 5.1222973e-08;
        local_2c0 = local_1e0 + 5.1222973e-08;
        fStack_2bc = fStack_1dc + 5.1222973e-08;
        fStack_2b8 = fStack_1d8 + 5.1222973e-08;
        fStack_2b4 = fStack_1d4 + 5.1222973e-08;
        fStack_2b0 = fStack_1d0 + 5.1222973e-08;
        fStack_2ac = fStack_1cc + 5.1222973e-08;
        fStack_2a8 = fStack_1c8 + 5.1222973e-08;
        fStack_2a4 = fStack_204 + 5.1222973e-08;
        local_2e8 = &local_b00;
        local_2f0 = &local_ae0;
        local_2f8 = _ps256_cephes_tanh_p4;
        local_2e0 = CONCAT44(fStack_adc,local_ae0);
        uStack_2d8 = CONCAT44(fStack_ad4,fStack_ad8);
        uStack_2d0 = CONCAT44(fStack_acc,fStack_ad0);
        uStack_2c8 = CONCAT44(uStack_a08._4_4_,fStack_ac8);
        local_280 = local_2c0 * local_ae0;
        fStack_27c = fStack_2bc * fStack_adc;
        fStack_278 = fStack_2b8 * fStack_ad8;
        fStack_274 = fStack_2b4 * fStack_ad4;
        fStack_270 = fStack_2b0 * fStack_ad0;
        fStack_26c = fStack_2ac * fStack_acc;
        fStack_268 = fStack_2a8 * fStack_ac8;
        local_2a0[0] = 1.48572235e-05;
        local_2a0[1] = 1.48572235e-05;
        afStack_298[0] = 1.48572235e-05;
        afStack_298[1] = 1.48572235e-05;
        afStack_290[0] = 1.48572235e-05;
        afStack_290[1] = 1.48572235e-05;
        afStack_288[0] = 1.48572235e-05;
        afStack_288[1] = 1.48572235e-05;
        local_360 = local_280 + 1.48572235e-05;
        fStack_35c = fStack_27c + 1.48572235e-05;
        fStack_358 = fStack_278 + 1.48572235e-05;
        fStack_354 = fStack_274 + 1.48572235e-05;
        fStack_350 = fStack_270 + 1.48572235e-05;
        fStack_34c = fStack_26c + 1.48572235e-05;
        fStack_348 = fStack_268 + 1.48572235e-05;
        fStack_344 = fStack_2a4 + 1.48572235e-05;
        local_388 = &local_b00;
        local_390 = &local_ae0;
        local_398 = _ps256_cephes_tanh_p5;
        local_380 = CONCAT44(fStack_adc,local_ae0);
        uStack_378 = CONCAT44(fStack_ad4,fStack_ad8);
        uStack_370 = CONCAT44(fStack_acc,fStack_ad0);
        uStack_368 = CONCAT44(uStack_a08._4_4_,fStack_ac8);
        local_320 = local_360 * local_ae0;
        fStack_31c = fStack_35c * fStack_adc;
        fStack_318 = fStack_358 * fStack_ad8;
        fStack_314 = fStack_354 * fStack_ad4;
        fStack_310 = fStack_350 * fStack_ad0;
        fStack_30c = fStack_34c * fStack_acc;
        fStack_308 = fStack_348 * fStack_ac8;
        local_340[0] = 0.00063726195;
        local_340[1] = 0.00063726195;
        afStack_338[0] = 0.00063726195;
        afStack_338[1] = 0.00063726195;
        afStack_330[0] = 0.00063726195;
        afStack_330[1] = 0.00063726195;
        afStack_328[0] = 0.00063726195;
        afStack_328[1] = 0.00063726195;
        local_400 = local_320 + 0.00063726195;
        fStack_3fc = fStack_31c + 0.00063726195;
        fStack_3f8 = fStack_318 + 0.00063726195;
        fStack_3f4 = fStack_314 + 0.00063726195;
        fStack_3f0 = fStack_310 + 0.00063726195;
        fStack_3ec = fStack_30c + 0.00063726195;
        fStack_3e8 = fStack_308 + 0.00063726195;
        fStack_3e4 = fStack_344 + 0.00063726195;
        local_428 = &local_b00;
        local_430 = &local_ae0;
        local_438 = _ps256_cephes_tanh_p6;
        local_420 = CONCAT44(fStack_adc,local_ae0);
        uStack_418 = CONCAT44(fStack_ad4,fStack_ad8);
        uStack_410 = CONCAT44(fStack_acc,fStack_ad0);
        uStack_408 = CONCAT44(uStack_a08._4_4_,fStack_ac8);
        local_3c0 = local_400 * local_ae0;
        fStack_3bc = fStack_3fc * fStack_adc;
        fStack_3b8 = fStack_3f8 * fStack_ad8;
        fStack_3b4 = fStack_3f4 * fStack_ad4;
        fStack_3b0 = fStack_3f0 * fStack_ad0;
        fStack_3ac = fStack_3ec * fStack_acc;
        fStack_3a8 = fStack_3e8 * fStack_ac8;
        local_3e0[0] = 0.0048935246;
        local_3e0[1] = 0.0048935246;
        afStack_3d8[0] = 0.0048935246;
        afStack_3d8[1] = 0.0048935246;
        afStack_3d0[0] = 0.0048935246;
        afStack_3d0[1] = 0.0048935246;
        afStack_3c8[0] = 0.0048935246;
        afStack_3c8[1] = 0.0048935246;
        fStack_ae4 = fStack_3e4 + 0.0048935246;
        local_a60 = CONCAT44(fStack_3bc + 0.0048935246,local_3c0 + 0.0048935246);
        uStack_a58 = CONCAT44(fStack_3b4 + 0.0048935246,fStack_3b8 + 0.0048935246);
        uStack_a50 = CONCAT44(fStack_3ac + 0.0048935246,fStack_3b0 + 0.0048935246);
        uStack_a48 = CONCAT44(fStack_ae4,fStack_3a8 + 0.0048935246);
        local_a80 = local_ac0._0_8_;
        uStack_a78 = local_ac0._8_8_;
        uStack_a70 = local_ac0._16_8_;
        uStack_a68 = local_ac0._24_8_;
        local_b00 = (local_3c0 + 0.0048935246) * (float)local_a20;
        fStack_afc = (fStack_3bc + 0.0048935246) * local_a20._4_4_;
        fStack_af8 = (fStack_3b8 + 0.0048935246) * (float)uStack_a18;
        fStack_af4 = (fStack_3b4 + 0.0048935246) * uStack_a18._4_4_;
        fStack_af0 = (fStack_3b0 + 0.0048935246) * (float)uStack_a10;
        fStack_aec = (fStack_3ac + 0.0048935246) * uStack_a10._4_4_;
        fStack_ae8 = (fStack_3a8 + 0.0048935246) * (float)uStack_a08;
        local_4c8 = &local_ae0;
        local_4d0 = _ps256_cephes_tanh_p7;
        local_4d8 = _ps256_cephes_tanh_p8;
        fStack_484 = uStack_a08._4_4_;
        local_4c0[0] = 1.1982584e-06;
        local_4c0[1] = 1.1982584e-06;
        afStack_4b8[0] = 1.1982584e-06;
        afStack_4b8[1] = 1.1982584e-06;
        afStack_4b0[0] = 1.1982584e-06;
        afStack_4b0[1] = 1.1982584e-06;
        afStack_4a8[0] = 1.1982584e-06;
        afStack_4a8[1] = 1.1982584e-06;
        local_460 = local_ae0 * 1.1982584e-06;
        fStack_45c = fStack_adc * 1.1982584e-06;
        fStack_458 = fStack_ad8 * 1.1982584e-06;
        fStack_454 = fStack_ad4 * 1.1982584e-06;
        fStack_450 = fStack_ad0 * 1.1982584e-06;
        fStack_44c = fStack_acc * 1.1982584e-06;
        fStack_448 = fStack_ac8 * 1.1982584e-06;
        local_480[0] = 0.00011853471;
        local_480[1] = 0.00011853471;
        afStack_478[0] = 0.00011853471;
        afStack_478[1] = 0.00011853471;
        afStack_470[0] = 0.00011853471;
        afStack_470[1] = 0.00011853471;
        afStack_468[0] = 0.00011853471;
        afStack_468[1] = 0.00011853471;
        local_540 = local_460 + 0.00011853471;
        fStack_53c = fStack_45c + 0.00011853471;
        fStack_538 = fStack_458 + 0.00011853471;
        fStack_534 = fStack_454 + 0.00011853471;
        fStack_530 = fStack_450 + 0.00011853471;
        fStack_52c = fStack_44c + 0.00011853471;
        fStack_528 = fStack_448 + 0.00011853471;
        fStack_524 = uStack_a08._4_4_ + 0.00011853471;
        local_568 = &local_b20;
        local_570 = &local_ae0;
        local_578 = _ps256_cephes_tanh_p9;
        local_560 = CONCAT44(fStack_adc,local_ae0);
        uStack_558 = CONCAT44(fStack_ad4,fStack_ad8);
        uStack_550 = CONCAT44(fStack_acc,fStack_ad0);
        uStack_548 = CONCAT44(uStack_a08._4_4_,fStack_ac8);
        local_500 = local_540 * local_ae0;
        fStack_4fc = fStack_53c * fStack_adc;
        fStack_4f8 = fStack_538 * fStack_ad8;
        fStack_4f4 = fStack_534 * fStack_ad4;
        fStack_4f0 = fStack_530 * fStack_ad0;
        fStack_4ec = fStack_52c * fStack_acc;
        fStack_4e8 = fStack_528 * fStack_ac8;
        local_520[0] = 0.0022684347;
        local_520[1] = 0.0022684347;
        afStack_518[0] = 0.0022684347;
        afStack_518[1] = 0.0022684347;
        afStack_510[0] = 0.0022684347;
        afStack_510[1] = 0.0022684347;
        afStack_508[0] = 0.0022684347;
        afStack_508[1] = 0.0022684347;
        local_5e0 = local_500 + 0.0022684347;
        fStack_5dc = fStack_4fc + 0.0022684347;
        fStack_5d8 = fStack_4f8 + 0.0022684347;
        fStack_5d4 = fStack_4f4 + 0.0022684347;
        fStack_5d0 = fStack_4f0 + 0.0022684347;
        fStack_5cc = fStack_4ec + 0.0022684347;
        fStack_5c8 = fStack_4e8 + 0.0022684347;
        fStack_5c4 = fStack_524 + 0.0022684347;
        local_608 = &local_b20;
        local_610 = &local_ae0;
        local_618 = _ps256_cephes_tanh_p6;
        local_600 = CONCAT44(fStack_adc,local_ae0);
        uStack_5f8 = CONCAT44(fStack_ad4,fStack_ad8);
        uStack_5f0 = CONCAT44(fStack_acc,fStack_ad0);
        uStack_5e8 = CONCAT44(uStack_a08._4_4_,fStack_ac8);
        local_5a0 = local_5e0 * local_ae0;
        fStack_59c = fStack_5dc * fStack_adc;
        fStack_598 = fStack_5d8 * fStack_ad8;
        fStack_594 = fStack_5d4 * fStack_ad4;
        fStack_590 = fStack_5d0 * fStack_ad0;
        fStack_58c = fStack_5cc * fStack_acc;
        fStack_588 = fStack_5c8 * fStack_ac8;
        local_5c0[0] = 0.0048935246;
        local_5c0[1] = 0.0048935246;
        afStack_5b8[0] = 0.0048935246;
        afStack_5b8[1] = 0.0048935246;
        afStack_5b0[0] = 0.0048935246;
        afStack_5b0[1] = 0.0048935246;
        afStack_5a8[0] = 0.0048935246;
        afStack_5a8[1] = 0.0048935246;
        local_b20 = local_5a0 + 0.0048935246;
        fStack_b1c = fStack_59c + 0.0048935246;
        fStack_b18 = fStack_598 + 0.0048935246;
        fStack_b14 = fStack_594 + 0.0048935246;
        fStack_b10 = fStack_590 + 0.0048935246;
        fStack_b0c = fStack_58c + 0.0048935246;
        fStack_b08 = fStack_588 + 0.0048935246;
        fStack_b04 = fStack_5c4 + 0.0048935246;
        local_60 = CONCAT44(fStack_afc,local_b00);
        uStack_58 = CONCAT44(fStack_af4,fStack_af8);
        uStack_50 = CONCAT44(fStack_aec,fStack_af0);
        uStack_48 = CONCAT44(fStack_ae4,fStack_ae8);
        local_80 = CONCAT44(fStack_b1c,local_b20);
        uStack_78 = CONCAT44(fStack_b14,fStack_b18);
        uStack_70 = CONCAT44(fStack_b0c,fStack_b10);
        uStack_68 = CONCAT44(fStack_b04,fStack_b08);
        auVar9._8_8_ = uStack_58;
        auVar9._0_8_ = local_60;
        auVar9._16_8_ = uStack_50;
        auVar9._24_8_ = uStack_48;
        auVar8._8_8_ = uStack_78;
        auVar8._0_8_ = local_80;
        auVar8._16_8_ = uStack_70;
        auVar8._24_8_ = uStack_68;
        local_b40 = vdivps_avx(auVar9,auVar8);
        local_ba0._0_4_ = local_760._0_4_;
        local_ba0._4_4_ = local_760._4_4_;
        uStack_b98._0_4_ = local_760._8_4_;
        uStack_b98._4_4_ = local_760._12_4_;
        uStack_b90._0_4_ = auStack_750._0_4_;
        uStack_b90._4_4_ = auStack_750._4_4_;
        uStack_b88._0_4_ = auStack_750._8_4_;
        uStack_b88._4_4_ = auStack_750._12_4_;
        local_bc0._0_4_ = local_b40._0_4_;
        local_bc0._4_4_ = local_b40._4_4_;
        uStack_bb8._0_4_ = local_b40._8_4_;
        uStack_bb8._4_4_ = local_b40._12_4_;
        uStack_bb0._0_4_ = local_b40._16_4_;
        uStack_bb0._4_4_ = local_b40._20_4_;
        uStack_ba8._0_4_ = local_b40._24_4_;
        uStack_ba8._4_4_ = local_b40._28_4_;
        fStack_d24 = uStack_b88._4_4_ + uStack_ba8._4_4_;
        local_f20 = CONCAT44(local_ba0._4_4_ + local_bc0._4_4_,(float)local_ba0 + (float)local_bc0);
        uStackY_f18 = CONCAT44(uStack_b98._4_4_ + uStack_bb8._4_4_,
                               (float)uStack_b98 + (float)uStack_bb8);
        uStackY_f10 = CONCAT44(uStack_b90._4_4_ + uStack_bb0._4_4_,
                               (float)uStack_b90 + (float)uStack_bb0);
        uStackY_f08 = CONCAT44(fStack_d24,(float)uStack_b88 + (float)uStack_ba8);
        local_ce0 = local_f20;
        uStack_cd8 = uStackY_f18;
        uStack_cd0 = uStackY_f10;
        uStack_cc8 = uStackY_f08;
        local_d40 = ((float)local_ba0 + (float)local_bc0) * (float)local_be0;
        fStack_d3c = (local_ba0._4_4_ + local_bc0._4_4_) * local_be0._4_4_;
        fStack_d38 = ((float)uStack_b98 + (float)uStack_bb8) * (float)uStack_bd8;
        fStack_d34 = (uStack_b98._4_4_ + uStack_bb8._4_4_) * uStack_bd8._4_4_;
        fStack_d30 = ((float)uStack_b90 + (float)uStack_bb0) * (float)uStack_bd0;
        fStack_d2c = (uStack_b90._4_4_ + uStack_bb0._4_4_) * uStack_bd0._4_4_;
        fStack_d28 = ((float)uStack_b88 + (float)uStack_ba8) * (float)uStack_bc8;
        local_d20._0_4_ = local_7a0._0_4_;
        local_d20._4_4_ = local_7a0._4_4_;
        uStack_d18._0_4_ = local_7a0._8_4_;
        uStack_d18._4_4_ = local_7a0._12_4_;
        uStack_d10._0_4_ = auStack_790._0_4_;
        uStack_d10._4_4_ = auStack_790._4_4_;
        uStack_d08._0_4_ = auStack_790._8_4_;
        uStack_d08._4_4_ = auStack_790._12_4_;
        local_f20 = CONCAT44(local_d20._4_4_ * fStack_d3c,(float)local_d20 * local_d40);
        uStackY_f18 = CONCAT44(uStack_d18._4_4_ * fStack_d34,(float)uStack_d18 * fStack_d38);
        uStackY_f10 = CONCAT44(uStack_d10._4_4_ * fStack_d2c,(float)uStack_d10 * fStack_d30);
        uStackY_f08 = CONCAT44(uStack_d08._4_4_,(float)uStack_d08 * fStack_d28);
        local_9d8 = local_dd8;
        local_a00 = local_f20;
        uStack_9f8 = uStackY_f18;
        uStack_9f0 = uStackY_f10;
        uStack_9e8 = uStackY_f08;
        *(undefined8 *)local_dd8 = local_f20;
        *(undefined8 *)(local_dd8 + 2) = uStackY_f18;
        *(undefined8 *)(local_dd8 + 4) = uStackY_f10;
        *(undefined8 *)(local_dd8 + 6) = uStackY_f08;
        local_dd8 = local_dd8 + 8;
        local_d20 = local_7a0._0_8_;
        uStack_d18 = local_7a0._8_8_;
        uStack_d10 = auStack_790._0_8_;
        uStack_d08 = auStack_790._8_8_;
        local_ca0 = local_720._0_8_;
        uStack_c98 = local_720._8_8_;
        uStack_c90 = auStack_710._0_8_;
        uStack_c88 = auStack_710._8_8_;
        local_c60 = local_6e0._0_8_;
        uStack_c58 = local_6e0._8_8_;
        uStack_c50 = local_6e0._16_8_;
        uStack_c48 = local_6e0._24_8_;
        local_c20 = local_d00;
        uStack_c18 = uStack_cf8;
        uStack_c10 = uStack_cf0;
        uStack_c08 = uStack_ce8;
        local_c00 = local_d00;
        uStack_bf8 = uStack_cf8;
        uStack_bf0 = uStack_cf0;
        uStack_be8 = uStack_ce8;
        local_be0 = local_d00;
        uStack_bd8 = uStack_cf8;
        uStack_bd0 = uStack_cf0;
        uStack_bc8 = uStack_ce8;
        local_bc0 = local_b40._0_8_;
        uStack_bb8 = local_b40._8_8_;
        uStack_bb0 = local_b40._16_8_;
        uStack_ba8 = local_b40._24_8_;
        local_ba0 = local_760._0_8_;
        uStack_b98 = local_760._8_8_;
        uStack_b90 = auStack_750._0_8_;
        uStack_b88 = auStack_750._8_8_;
        local_b60 = local_d00;
        uStack_b58 = uStack_cf8;
        uStack_b50 = uStack_cf0;
        uStack_b48 = uStack_ce8;
        local_a20 = local_ac0._0_8_;
        uStack_a18 = local_ac0._8_8_;
        uStack_a10 = local_ac0._16_8_;
        uStack_a08 = local_ac0._24_8_;
        fStack_584 = fStack_5c4;
        fStack_4e4 = fStack_524;
        local_4a0 = local_ae0;
        fStack_49c = fStack_adc;
        fStack_498 = fStack_ad8;
        fStack_494 = fStack_ad4;
        fStack_490 = fStack_ad0;
        fStack_48c = fStack_acc;
        fStack_488 = fStack_ac8;
        fStack_444 = fStack_484;
        fStack_3a4 = fStack_3e4;
        fStack_304 = fStack_344;
        fStack_264 = fStack_2a4;
        fStack_1c4 = fStack_204;
        fStack_124 = fStack_164;
        local_e0 = local_ae0;
        fStack_dc = fStack_adc;
        fStack_d8 = fStack_ad8;
        fStack_d4 = fStack_ad4;
        fStack_d0 = fStack_ad0;
        fStack_cc = fStack_acc;
        fStack_c8 = fStack_ac8;
        fStack_84 = fStack_c4;
      }
      local_95c = 0x3f000000;
      local_970 = 0x3f000000;
      uStack_96c = 0x3f000000;
      uStack_968 = 0x3f000000;
      uStack_964 = 0x3f000000;
      local_974 = 0x3f800000;
      local_990 = 0x3f800000;
      uStack_98c = 0x3f800000;
      uStack_988 = 0x3f800000;
      uStack_984 = 0x3f800000;
      local_994 = 0x3f4c4229;
      local_9b0 = 0x3f4c4229;
      uStack_9ac = 0x3f4c4229;
      uStack_9a8 = 0x3f4c4229;
      uStack_9a4 = 0x3f4c4229;
      local_9b4 = 0x3d372713;
      local_9d0 = 0x3d372713;
      uStack_9cc = 0x3d372713;
      uStack_9c8 = 0x3d372713;
      uStack_9c4 = 0x3d372713;
      local_7d0 = local_d68;
      local_6e0 = auVar11;
      local_e00 = local_830;
      for (; local_e30 + 3 < local_dc8; local_e30 = local_e30 + 4) {
        local_958 = local_dd8;
        uVar4 = *(undefined8 *)local_dd8;
        uVar5 = *(undefined8 *)(local_dd8 + 2);
        local_8a0._0_4_ = (float)uVar4;
        fVar10 = (float)local_8a0;
        local_8a0._4_4_ = (float)((ulong)uVar4 >> 0x20);
        fVar12 = local_8a0._4_4_;
        uStack_898._0_4_ = (float)uVar5;
        fVar13 = (float)uStack_898;
        uStack_898._4_4_ = (float)((ulong)uVar5 >> 0x20);
        fVar15 = uStack_898._4_4_;
        local_8d0 = CONCAT44(local_8a0._4_4_ * local_8a0._4_4_,(float)local_8a0 * (float)local_8a0);
        uStack_8c8 = CONCAT44(uStack_898._4_4_ * uStack_898._4_4_,
                              (float)uStack_898 * (float)uStack_898);
        fVar17 = (float)local_8a0 * (float)local_8a0 * (float)local_8a0;
        fVar18 = local_8a0._4_4_ * local_8a0._4_4_ * local_8a0._4_4_;
        fVar19 = (float)uStack_898 * (float)uStack_898 * (float)uStack_898;
        fVar16 = uStack_898._4_4_ * uStack_898._4_4_ * uStack_898._4_4_;
        local_8f0 = CONCAT44(fVar18,fVar17);
        uStack_8e8 = CONCAT44(fVar16,fVar19);
        fVar17 = fVar17 * 0.044715;
        fVar18 = fVar18 * 0.044715;
        fVar19 = fVar19 * 0.044715;
        fVar16 = fVar16 * 0.044715;
        local_f90 = CONCAT44(fVar18,fVar17);
        uStackY_f88 = CONCAT44(fVar16,fVar19);
        local_870 = local_f90;
        uStack_868 = uStackY_f88;
        local_8a0._0_4_ = (float)local_8a0 + fVar17;
        local_8a0._4_4_ = local_8a0._4_4_ + fVar18;
        uStack_898._0_4_ = (float)uStack_898 + fVar19;
        uStack_898._4_4_ = uStack_898._4_4_ + fVar16;
        local_f90 = CONCAT44(local_8a0._4_4_,(float)local_8a0);
        uStackY_f88 = CONCAT44(uStack_898._4_4_,(float)uStack_898);
        local_910 = local_f90;
        uStack_908 = uStackY_f88;
        uStackY_f88 = CONCAT44(uStack_898._4_4_ * 0.7978845,(float)uStack_898 * 0.7978845);
        afVar20[2] = 0.7978845;
        afVar20[3] = 0.7978845;
        afVar20[0] = (float)local_8a0 * 0.7978845;
        afVar20[1] = local_8a0._4_4_ * 0.7978845;
        uVar14 = uStackY_f88;
        local_900 = 0x3f4c42293f4c4229;
        uStack_8f8 = 0x3f4c42293f4c4229;
        local_8e0 = 0x3d3727133d372713;
        uStack_8d8 = 0x3d3727133d372713;
        local_8c0 = uVar4;
        uStack_8b8 = uVar5;
        local_8b0 = uVar4;
        uStack_8a8 = uVar5;
        local_8a0 = uVar4;
        uStack_898 = uVar5;
        local_860 = uVar4;
        uStack_858 = uVar5;
        afVar20 = tanh_ps(afVar20);
        local_890._0_4_ = afVar20[0];
        local_890._4_4_ = afVar20[1];
        uStack_888._0_4_ = (float)uVar14;
        uStack_888._4_4_ = (float)((ulong)uVar14 >> 0x20);
        local_f90 = CONCAT44(local_890._4_4_ + 1.0,(float)local_890 + 1.0);
        uStackY_f88 = CONCAT44(uStack_888._4_4_ + 1.0,(float)uStack_888 + 1.0);
        local_920 = local_f90;
        uStack_918 = uStackY_f88;
        local_950 = ((float)local_890 + 1.0) * fVar10;
        fStack_94c = (local_890._4_4_ + 1.0) * fVar12;
        fStack_948 = ((float)uStack_888 + 1.0) * fVar13;
        fStack_944 = (uStack_888._4_4_ + 1.0) * fVar15;
        local_f90 = CONCAT44(fStack_94c * 0.5,local_950 * 0.5);
        uStackY_f88 = CONCAT44(fStack_944 * 0.5,fStack_948 * 0.5);
        local_838 = local_dd8;
        local_850 = local_f90;
        uStack_848 = uStackY_f88;
        *(undefined8 *)local_dd8 = local_f90;
        *(undefined8 *)(local_dd8 + 2) = uStackY_f88;
        local_dd8 = local_dd8 + 4;
        local_940 = 0x3f0000003f000000;
        uStack_938 = 0x3f0000003f000000;
        local_930 = uVar4;
        uStack_928 = uVar5;
        local_890 = afVar20._0_8_;
        uStack_888 = uVar14;
        local_880 = 0x3f8000003f800000;
        uStack_878 = 0x3f8000003f800000;
      }
      for (; local_e30 < local_dc8; local_e30 = local_e30 + 1) {
        fVar10 = *local_dd8;
        fVar12 = tanhf((*local_dd8 + *local_dd8 * 0.044715 * *local_dd8 * *local_dd8) * 0.7978845);
        *local_dd8 = fVar10 * 0.5 * (fVar12 + 1.0);
        local_dd8 = local_dd8 + 1;
      }
    }
    local_d94 = 0;
  }
  return local_d94;
}

Assistant:

int GELU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}